

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall
soul::HEARTGenerator::generateFunctions
          (HEARTGenerator *this,ArrayView<soul::pool_ref<soul::AST::Function>_> functions)

{
  bool bVar1;
  pool_ref<soul::AST::Function> *ppVar2;
  Function *pFVar3;
  pool_ref<soul::AST::Function> *f;
  pool_ref<soul::AST::Function> *__end2;
  pool_ref<soul::AST::Function> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::Function>_> *__range2;
  HEARTGenerator *this_local;
  ArrayView<soul::pool_ref<soul::AST::Function>_> functions_local;
  
  functions_local.s = functions.e;
  this_local = (HEARTGenerator *)functions.s;
  __end2 = ArrayView<soul::pool_ref<soul::AST::Function>_>::begin
                     ((ArrayView<soul::pool_ref<soul::AST::Function>_> *)&this_local);
  ppVar2 = ArrayView<soul::pool_ref<soul::AST::Function>_>::end
                     ((ArrayView<soul::pool_ref<soul::AST::Function>_> *)&this_local);
  for (; __end2 != ppVar2; __end2 = __end2 + 1) {
    pFVar3 = pool_ref<soul::AST::Function>::operator->(__end2);
    bVar1 = AST::Function::isGeneric(pFVar3);
    if (!bVar1) {
      pFVar3 = pool_ref::operator_cast_to_Function_((pool_ref *)__end2);
      generateFunction(this,pFVar3);
    }
  }
  return;
}

Assistant:

void generateFunctions (ArrayView<pool_ref<AST::Function>> functions)
    {
        for (auto& f : functions)
            if (! f->isGeneric())
                generateFunction (f);
    }